

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

void tdefl_optimize_huffman_table
               (tdefl_compressor *d,int table_num,int table_len,int code_size_limit,int static_table
               )

{
  byte bVar1;
  uint uVar2;
  long lVar3;
  tdefl_sym_freq *A;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  mz_uint code_size;
  mz_uint code;
  mz_uint rev_code;
  mz_uint16 *pSym_count;
  int num_used_syms;
  tdefl_sym_freq *pSyms;
  tdefl_sym_freq syms1 [288];
  tdefl_sym_freq syms0 [288];
  mz_uint next_code [33];
  int num_codes [33];
  int l;
  int j;
  int i;
  uint local_a58;
  uint local_a54;
  int local_a44;
  undefined2 local_5b8 [576];
  uint auStack_138 [36];
  int local_a8 [33];
  uint local_24;
  uint local_20;
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  long local_8;
  
  local_18 = in_R8D;
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  memset(local_a8,0,0x84);
  if (local_18 == 0) {
    local_a44 = 0;
    lVar3 = local_8 + 0x81ca + (long)local_c * 0x240;
    for (local_1c = 0; local_1c < local_10; local_1c = local_1c + 1) {
      if (*(short *)(lVar3 + (long)local_1c * 2) != 0) {
        *(undefined2 *)(auStack_138 + (long)local_a44 + -0x120) =
             *(undefined2 *)(lVar3 + (long)local_1c * 2);
        *(short *)((long)auStack_138 + (long)local_a44 * 4 + -0x47e) = (short)local_1c;
        local_a44 = local_a44 + 1;
      }
    }
    A = tdefl_radix_sort_syms
                  ((mz_uint)syms1[0x71],(tdefl_sym_freq *)syms1._440_8_,
                   (tdefl_sym_freq *)syms1._432_8_);
    tdefl_calculate_minimum_redundancy(A,local_a44);
    for (local_1c = 0; local_1c < local_a44; local_1c = local_1c + 1) {
      local_a8[A[local_1c].m_key] = local_a8[A[local_1c].m_key] + 1;
    }
    tdefl_huffman_enforce_max_code_size(local_a8,local_a44,local_14);
    memset((void *)(local_8 + 0x8f4a + (long)local_c * 0x120),0,0x120);
    memset((void *)(local_8 + 0x888a + (long)local_c * 0x240),0,0x240);
    local_20 = local_a44;
    for (local_1c = 1; local_1c <= local_14; local_1c = local_1c + 1) {
      for (local_24 = local_a8[local_1c]; 0 < (int)local_24; local_24 = local_24 + -1) {
        local_20 = local_20 + -1;
        *(char *)(local_8 + 0x8f4a + (long)local_c * 0x120 + (ulong)A[(int)local_20].m_sym_index) =
             (char)local_1c;
      }
    }
  }
  else {
    for (local_1c = 0; local_1c < local_10; local_1c = local_1c + 1) {
      bVar1 = *(byte *)(local_8 + 0x8f4a + (long)local_c * 0x120 + (long)local_1c);
      local_a8[bVar1] = local_a8[bVar1] + 1;
    }
  }
  auStack_138[1] = 0;
  local_20 = 0;
  for (local_1c = 2; local_1c <= local_14; local_1c = local_1c + 1) {
    local_20 = (local_20 + local_a8[local_1c + -1]) * 2;
    auStack_138[local_1c] = local_20;
  }
  for (local_1c = 0; local_1c < local_10; local_1c = local_1c + 1) {
    local_a54 = 0;
    uVar2 = (uint)*(byte *)(local_8 + 0x8f4a + (long)local_c * 0x120 + (long)local_1c);
    if (uVar2 != 0) {
      local_a58 = auStack_138[uVar2];
      auStack_138[uVar2] = local_a58 + 1;
      for (local_24 = uVar2; 0 < (int)local_24; local_24 = local_24 - 1) {
        local_a54 = local_a54 << 1 | local_a58 & 1;
        local_a58 = local_a58 >> 1;
      }
      *(short *)(local_8 + 0x888a + (long)local_c * 0x240 + (long)local_1c * 2) = (short)local_a54;
    }
  }
  return;
}

Assistant:

static void
tdefl_optimize_huffman_table(tdefl_compressor* d, int table_num, int table_len, int code_size_limit, int static_table) {

    int i, j, l, num_codes[1 + TDEFL_MAX_SUPPORTED_HUFF_CODESIZE];
    mz_uint next_code[TDEFL_MAX_SUPPORTED_HUFF_CODESIZE + 1];
    MZ_CLEAR_OBJ(num_codes);
    if (static_table) {
        for (i = 0; i < table_len; i++)
            num_codes[d->m_huff_code_sizes[table_num][i]]++;
    }
    else {
        tdefl_sym_freq syms0[TDEFL_MAX_HUFF_SYMBOLS], syms1[TDEFL_MAX_HUFF_SYMBOLS], * pSyms;
        int num_used_syms = 0;
        const mz_uint16* pSym_count = &d->m_huff_count[table_num][0];
        for (i = 0; i < table_len; i++)
            if (pSym_count[i]) {
                syms0[num_used_syms].m_key = (mz_uint16)pSym_count[i];
                syms0[num_used_syms++].m_sym_index = (mz_uint16)i;
            }

        pSyms = tdefl_radix_sort_syms(num_used_syms, syms0, syms1);
        tdefl_calculate_minimum_redundancy(pSyms, num_used_syms);

        for (i = 0; i < num_used_syms; i++)
            num_codes[pSyms[i].m_key]++;

        tdefl_huffman_enforce_max_code_size(num_codes, num_used_syms, code_size_limit);

        MZ_CLEAR_OBJ(d->m_huff_code_sizes[table_num]);
        MZ_CLEAR_OBJ(d->m_huff_codes[table_num]);
        for (i = 1, j = num_used_syms; i <= code_size_limit; i++)
            for (l = num_codes[i]; l > 0; l--)
                d->m_huff_code_sizes[table_num][pSyms[--j].m_sym_index] = (mz_uint8)(i);
    }

    next_code[1] = 0;
    for (j = 0, i = 2; i <= code_size_limit; i++)
        next_code[i] = j = ((j + num_codes[i - 1]) << 1);

    for (i = 0; i < table_len; i++) {
        mz_uint rev_code = 0, code, code_size;
        if ((code_size = d->m_huff_code_sizes[table_num][i]) == 0)
            continue;
        code = next_code[code_size]++;
        for (l = code_size; l > 0; l--, code >>= 1)
            rev_code = (rev_code << 1) | (code & 1);
        d->m_huff_codes[table_num][i] = (mz_uint16)rev_code;
    }
}